

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O3

int32_t internal_exr_compute_chunk_offset_size(exr_priv_part_t curpart)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  exr_attr_chlist_t *peVar6;
  exr_attr_tiledesc_t *peVar7;
  exr_attr_chlist_entry_t *peVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  byte bVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  int16_t iVar17;
  int iVar18;
  long lVar19;
  uint64_t uVar20;
  ulong uVar21;
  int iVar22;
  
  if (curpart->storage_mode == EXR_STORAGE_UNKNOWN) {
    if (curpart->chunk_count < 1) {
      return 0;
    }
    return curpart->chunk_count;
  }
  peVar6 = (curpart->channels->field_6).chlist;
  if (curpart->tiles == (exr_attribute_t *)0x0) {
    iVar1 = (curpart->data_window).min.y;
    iVar2 = (curpart->data_window).max.y;
    iVar3 = (curpart->data_window).min.x;
    iVar4 = (curpart->data_window).max.x;
    uVar9 = exr_compression_lines_per_chunk(curpart->comp_type);
    curpart->lines_per_chunk = (int16_t)uVar9;
    if (-1 < (int)uVar9) {
      if ((long)peVar6->num_channels < 1) {
        iVar17 = 0;
        uVar20 = 0;
      }
      else {
        iVar18 = (iVar4 - iVar3) + 1;
        peVar8 = peVar6->entries;
        uVar11 = (iVar1 + uVar9) - 1;
        uVar14 = 1 - (uVar9 + iVar1);
        if (0 < (int)(uVar9 + iVar1)) {
          uVar14 = uVar11;
        }
        lVar16 = 0;
        uVar20 = 0;
        iVar17 = 0;
        do {
          iVar15 = *(int *)(peVar8->reserved + lVar16 + 3);
          uVar5 = *(uint *)(peVar8->reserved + lVar16 + 7);
          iVar10 = 1;
          if (iVar15 < 2) {
            iVar10 = iVar18;
          }
          if (1 < iVar15 && iVar4 != iVar3) {
            iVar10 = iVar18 / iVar15;
          }
          uVar12 = uVar9;
          if (1 < (int)uVar5) {
            iVar15 = iVar1 % (int)uVar5;
            if (uVar9 == 1) {
              uVar12 = (uint)(iVar15 == 0);
            }
            else {
              iVar22 = uVar5 - iVar15;
              if (iVar15 == 0) {
                iVar22 = 0;
              }
              uVar12 = 0;
              iVar15 = uVar11 - uVar14 % uVar5;
              if (iVar22 + iVar1 <= iVar15) {
                uVar12 = (iVar15 - (iVar22 + iVar1)) / (int)uVar5 + 1;
              }
            }
          }
          if (1 < (int)uVar5) {
            iVar17 = 1;
          }
          uVar20 = uVar20 + ((long)iVar10 <<
                            (2U - (*(int *)(peVar8->reserved + lVar16 + -5) == 1) & 0x3f)) *
                            (long)(int)uVar12;
          lVar16 = lVar16 + 0x20;
        } while ((long)peVar6->num_channels * 0x20 != lVar16);
      }
      curpart->unpacked_size_per_chunk = uVar20;
      curpart->chan_has_line_sampling = iVar17;
      return (int)((iVar2 - iVar1) + uVar9) / (int)uVar9;
    }
    return -1;
  }
  peVar7 = (curpart->tiles->field_6).tiledesc;
  bVar13 = peVar7->level_and_round & 0xf;
  if (bVar13 < 2) {
    if (0 < (long)curpart->num_tile_levels_x) {
      lVar19 = 0;
      lVar16 = 0;
      do {
        lVar16 = lVar16 + (long)curpart->tile_level_tile_count_y[lVar19] *
                          (long)curpart->tile_level_tile_count_x[lVar19];
        lVar19 = lVar19 + 1;
      } while (curpart->num_tile_levels_x != lVar19);
      if (0x7fffffff < lVar16) {
        return -1;
      }
      goto LAB_0012570a;
    }
  }
  else {
    if (bVar13 != 2) {
      return -1;
    }
    if (0 < (long)curpart->num_tile_levels_x) {
      lVar19 = 0;
      lVar16 = 0;
      do {
        if (0 < curpart->num_tile_levels_y) {
          uVar21 = 0;
          do {
            lVar16 = (long)curpart->tile_level_tile_count_y[uVar21] *
                     (long)curpart->tile_level_tile_count_x[lVar19] + lVar16;
            if (0x7fffffff < lVar16) {
              return -1;
            }
            uVar21 = uVar21 + 1;
          } while ((uint)curpart->num_tile_levels_y != uVar21);
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 != curpart->num_tile_levels_x);
      goto LAB_0012570a;
    }
  }
  lVar16 = 0;
LAB_0012570a:
  if ((long)peVar6->num_channels < 1) {
    uVar20 = 0;
  }
  else {
    lVar19 = 0;
    uVar20 = 0;
    do {
      uVar20 = uVar20 + ((ulong)peVar7->x_size <<
                        (2U - (*(int *)(peVar6->entries->reserved + lVar19 + -5) == 1) & 0x3f)) *
                        (ulong)peVar7->y_size;
      lVar19 = lVar19 + 0x20;
    } while ((long)peVar6->num_channels * 0x20 != lVar19);
  }
  curpart->unpacked_size_per_chunk = uVar20;
  curpart->chan_has_line_sampling = 0;
  return (int32_t)lVar16;
}

Assistant:

int32_t
internal_exr_compute_chunk_offset_size (exr_priv_part_t curpart)
{
    int32_t                  retval       = 0;
    const exr_attr_box2i_t   dw           = curpart->data_window;
    const exr_attr_chlist_t* channels     = curpart->channels->chlist;
    uint64_t                 unpackedsize = 0;
    uint64_t                 w;
    int                      hasLineSample = 0;

    if (curpart->storage_mode == EXR_STORAGE_UNKNOWN)
    {
        if (curpart->chunk_count > 0)
            return curpart->chunk_count;
        return 0;
    }

    w = (uint64_t) (((int64_t) dw.max.x) - ((int64_t) dw.min.x) + 1);

    if (curpart->tiles)
    {
        const exr_attr_tiledesc_t* tiledesc  = curpart->tiles->tiledesc;
        int64_t                    tilecount = 0;

        switch (EXR_GET_TILE_LEVEL_MODE ((*tiledesc)))
        {
            case EXR_TILE_ONE_LEVEL:
            case EXR_TILE_MIPMAP_LEVELS:
                for (int32_t l = 0; l < curpart->num_tile_levels_x; ++l)
                    tilecount +=
                        ((int64_t) curpart->tile_level_tile_count_x[l] *
                         (int64_t) curpart->tile_level_tile_count_y[l]);
                if (tilecount > (int64_t) INT_MAX) return -1;
                retval = (int32_t) tilecount;
                break;
            case EXR_TILE_RIPMAP_LEVELS:
                for (int32_t lx = 0; lx < curpart->num_tile_levels_x; ++lx)
                {
                    for (int32_t ly = 0; ly < curpart->num_tile_levels_y; ++ly)
                    {
                        tilecount +=
                            ((int64_t) curpart->tile_level_tile_count_x[lx] *
                             (int64_t) curpart->tile_level_tile_count_y[ly]);

                        if (tilecount > (int64_t) INT_MAX) return -1;
                    }
                }
                retval = (int32_t) tilecount;
                break;
            case EXR_TILE_LAST_TYPE:
            default: return -1;
        }

        for (int c = 0; c < channels->num_channels; ++c)
        {
            /* tiles do not allow x/y sub sampling */
            uint64_t cunpsz = 0;
            if (channels->entries[c].pixel_type == EXR_PIXEL_HALF)
                cunpsz = 2;
            else
                cunpsz = 4;
            cunpsz *= (uint64_t) tiledesc->x_size;
            cunpsz *= (uint64_t) tiledesc->y_size;
            unpackedsize += cunpsz;
        }
        curpart->unpacked_size_per_chunk = unpackedsize;
        curpart->chan_has_line_sampling  = ((int16_t) hasLineSample);
    }
    else
    {
        int linePerChunk, h;

        linePerChunk = exr_compression_lines_per_chunk (curpart->comp_type);

        curpart->lines_per_chunk = linePerChunk;

        if (linePerChunk < 0) return -1;

        for (int c = 0; c < channels->num_channels; ++c)
        {
            int xsamp  = channels->entries[c].x_sampling;
            int ysamp  = channels->entries[c].y_sampling;
            uint64_t cunpsz = 0;
            if (channels->entries[c].pixel_type == EXR_PIXEL_HALF)
                cunpsz = 2;
            else
                cunpsz = 4;
            cunpsz *= (uint64_t) compute_sampled_width (w, xsamp, dw.min.x);
            cunpsz *= (uint64_t) compute_sampled_height (linePerChunk, ysamp, dw.min.y);
            if (ysamp > 1)
                hasLineSample = 1;
            unpackedsize += cunpsz;
        }

        curpart->unpacked_size_per_chunk = unpackedsize;
        curpart->chan_has_line_sampling  = ((int16_t) hasLineSample);

        h      = (uint64_t) ((int64_t) dw.max.y - (int64_t) dw.min.y + 1);
        retval = (int32_t) ((h + linePerChunk - 1) / linePerChunk);
    }
    return retval;
}